

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_engine.hpp
# Opt level: O0

unsigned_long_long __thiscall
chaiscript::ChaiScript_Basic::eval<unsigned_long_long>
          (ChaiScript_Basic *this,string *t_input,Exception_Handler *t_handler,string *t_filename)

{
  unsigned_long_long uVar1;
  undefined1 local_38 [24];
  string *t_filename_local;
  Exception_Handler *t_handler_local;
  string *t_input_local;
  ChaiScript_Basic *this_local;
  
  local_38._16_8_ = t_filename;
  t_filename_local = (string *)t_handler;
  t_handler_local = (Exception_Handler *)t_input;
  t_input_local = (string *)this;
  eval((ChaiScript_Basic *)local_38,(string *)this,(Exception_Handler *)t_input,(string *)t_handler)
  ;
  uVar1 = detail::Dispatch_Engine::boxed_cast<unsigned_long_long>
                    (&this->m_engine,(Boxed_Value *)local_38);
  Boxed_Value::~Boxed_Value((Boxed_Value *)local_38);
  return uVar1;
}

Assistant:

T eval(const std::string &t_input, const Exception_Handler &t_handler = Exception_Handler(), const std::string &t_filename = "__EVAL__") {
      return m_engine.boxed_cast<T>(eval(t_input, t_handler, t_filename));
    }